

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::MpMessage<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  long lVar1;
  ushort type_card_00;
  FieldEntry *entry_00;
  uint64_t table_00;
  TcParseTableBase *this;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  uint *puVar8;
  FieldAux *pFVar9;
  ParseContext *pPVar10;
  Arena *arena;
  MessageLite *pMVar11;
  LogMessage *pLVar12;
  ParseContext *local_268;
  TcParseTableBase *local_220;
  anon_class_24_3_cc722eaf inner_loop;
  ParseContext *local_200;
  TcParseTableBase *inner_table;
  MessageLite **field;
  void *base;
  bool need_init;
  MessageLite *pMStack_1e0;
  bool is_oneof;
  byte local_1d3;
  ushort local_1d2;
  uint local_1d0;
  bool is_group;
  uint32_t uStack_1cc;
  uint16_t rep;
  uint32_t decoded_wiretype;
  uint32_t decoded_tag;
  MessageLite *local_1c0;
  MessageLite *local_1b8;
  ushort local_1ae;
  ushort local_1ac;
  ushort local_1aa;
  uint16_t rep_1;
  uint16_t card;
  FieldEntry *pFStack_1a8;
  uint16_t type_card;
  FieldEntry *entry;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  uint32_t has_bits_offset;
  LogMessage local_138;
  Voidify local_121;
  Nullable<const_char_*> local_120;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  Voidify local_101;
  Nullable<const_char_*> local_100;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  int old_group_depth;
  int old_depth;
  uint32_t local_e4;
  ParseContext *local_e0;
  TcParseTableBase *local_d8;
  ParseContext *local_d0;
  LimitToken local_c4;
  LogMessage local_c0;
  Voidify local_a9;
  Nullable<const_char_*> local_a8;
  Nullable<const_char_*> absl_log_internal_check_op_result_2;
  undefined4 local_98;
  int old_depth_1;
  LimitToken local_84;
  TcParseTableBase **ppTStack_80;
  LimitToken old;
  ParseContext *local_68;
  undefined1 local_50 [12];
  int size;
  ParseContext *local_40;
  TcParseTableBase *local_38;
  ParseContext *local_30;
  ParseContext *local_28;
  TcParseTableBase **local_20;
  ParseContext *local_18;
  TcParseTableBase **local_10;
  
  entry = (FieldEntry *)hasbits;
  hasbits_local = (uint64_t)table;
  table_local = (TcParseTableBase *)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)msg;
  msg_local = (MessageLite *)data.field_0;
  uVar3 = TcFieldData::entry_offset((TcFieldData *)&msg_local);
  pFStack_1a8 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>(table,(ulong)uVar3);
  local_1aa = pFStack_1a8->type_card;
  local_1ac = local_1aa & 0x30;
  if (local_1ac == 0x20) {
    local_1ae = local_1aa & 0x1c0;
    if (local_1ae == 0) {
      local_1b8 = msg_local;
      pcVar7 = MpRepeatedMessageOrGroup<false,false>
                         ((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                          (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
      return pcVar7;
    }
    if (local_1ae == 0x40) {
      local_1c0 = msg_local;
      pcVar7 = MpRepeatedMessageOrGroup<false,true>
                         ((MessageLite *)ptr_local,(char *)ctx_local,(ParseContext *)table_local,
                          (TcFieldData)msg_local,(TcParseTableBase *)hasbits_local,(uint64_t)entry);
      return pcVar7;
    }
    _decoded_wiretype = msg_local;
    pcVar7 = (char *)(**(code **)(hasbits_local + 0x30))
                               (ptr_local,ctx_local,table_local,msg_local,hasbits_local,entry);
    return pcVar7;
  }
  uStack_1cc = TcFieldData::tag((TcFieldData *)&msg_local);
  table_00 = hasbits_local;
  entry_00 = pFStack_1a8;
  local_1d0 = uStack_1cc & 7;
  local_1d2 = local_1aa & 0x1c0;
  local_1d3 = local_1d2 == 0x40;
  if (local_1d2 == 0) {
    if (local_1d0 == 2) goto LAB_002e44d5;
  }
  else if ((local_1d2 == 0x40) && (local_1d0 == 3)) {
LAB_002e44d5:
    base._7_1_ = local_1ac == 0x30;
    base._6_1_ = 0;
    if (local_1ac == 0x10) {
      anon_unknown_104::SetHas(pFStack_1a8,(MessageLite *)ptr_local);
    }
    else if ((bool)base._7_1_) {
      uVar3 = TcFieldData::tag((TcFieldData *)&msg_local);
      base._6_1_ = ChangeOneof((TcParseTableBase *)table_00,entry_00,uVar3 >> 3,
                               (ParseContext *)table_local,(MessageLite *)ptr_local);
    }
    field = (MessageLite **)
            MaybeGetSplitBase((MessageLite *)ptr_local,false,(TcParseTableBase *)hasbits_local);
    if (*(ushort *)hasbits_local != 0) {
      uVar4 = (uint)entry;
      puVar8 = RefAt<unsigned_int>(ptr_local,(ulong)(uint)*(ushort *)hasbits_local);
      *puVar8 = uVar4 | *puVar8;
    }
    inner_table = (TcParseTableBase *)
                  RefAt<google::protobuf::MessageLite*>(field,(ulong)pFStack_1a8->offset);
    type_card_00 = local_1aa;
    pFVar9 = TcParseTableBase::field_aux((TcParseTableBase *)hasbits_local,pFStack_1a8);
    inner_loop.inner_table = *(TcParseTableBase ***)pFVar9;
    pPVar10 = (ParseContext *)GetTableFromAux(type_card_00,(FieldAux)inner_loop.inner_table);
    local_200 = pPVar10;
    if (((base._6_1_ & 1) != 0) ||
       (lVar1._0_2_ = inner_table->has_bits_offset, lVar1._2_2_ = inner_table->extension_offset,
       lVar1._4_4_ = inner_table->max_field_number, lVar1 == 0)) {
      arena = MessageLite::GetArena((MessageLite *)ptr_local);
      pMVar11 = ClassData::New((ClassData *)(pPVar10->super_EpsCopyInputStream).zcis_,arena);
      *(MessageLite **)inner_table = pMVar11;
    }
    pPVar10 = ctx_local;
    this = table_local;
    local_220 = inner_table;
    inner_loop.field = (MessageLite **)&table_local;
    inner_loop.ctx = &local_200;
    if ((local_1d3 & 1) == 0) {
      ppTStack_80 = &local_220;
      EpsCopyInputStream::LimitToken::LimitToken(&local_84);
      local_38 = this;
      local_40 = pPVar10;
      unique0x10000737 = &local_84;
      local_50._4_4_ = ReadSize((char **)&local_40);
      if ((local_40 == (ParseContext *)0x0) || (*(int *)&this[1].class_data < 1)) {
        local_30 = (ParseContext *)0x0;
      }
      else {
        EpsCopyInputStream::PushLimit((EpsCopyInputStream *)local_50,(char *)this,(int)local_40);
        EpsCopyInputStream::LimitToken::operator=(stack0xffffffffffffffb8,(LimitToken *)local_50);
        EpsCopyInputStream::LimitToken::~LimitToken((LimitToken *)local_50);
        *(int *)&this[1].class_data = *(int *)&this[1].class_data + -1;
        local_30 = local_40;
      }
      if (local_30 == (ParseContext *)0x0) {
        local_68 = local_30;
      }
      else {
        absl_log_internal_check_op_result_2._4_4_ = *(int *)&this[1].class_data;
        local_20 = ppTStack_80;
        local_28 = local_30;
        local_68 = (ParseContext *)
                   ParseLoopPreserveNone
                             (*(MessageLite **)*ppTStack_80,(char *)local_30,
                              *(ParseContext **)ppTStack_80[1],*(TcParseTableBase **)ppTStack_80[2])
        ;
        if (local_68 != (ParseContext *)0x0) {
          iVar5 = absl::lts_20250127::log_internal::GetReferenceableValue
                            (absl_log_internal_check_op_result_2._4_4_);
          iVar6 = absl::lts_20250127::log_internal::GetReferenceableValue
                            (*(int *)&this[1].class_data);
          local_a8 = absl::lts_20250127::log_internal::Check_EQImpl
                               (iVar5,iVar6,"old_depth == depth_");
          if (local_a8 != (Nullable<const_char_*>)0x0) {
            pcVar7 = absl::lts_20250127::implicit_cast<char_const*>(local_a8);
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                       ,0x481,pcVar7);
            pLVar12 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_c0);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_a9,pLVar12);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_c0);
          }
          local_a8 = (Nullable<const_char_*>)0x0;
        }
        *(int *)&this[1].class_data = *(int *)&this[1].class_data + 1;
        EpsCopyInputStream::LimitToken::LimitToken(&local_c4,&local_84);
        bVar2 = EpsCopyInputStream::PopLimit((EpsCopyInputStream *)this,&local_c4);
        EpsCopyInputStream::LimitToken::~LimitToken(&local_c4);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          local_68 = (ParseContext *)0x0;
        }
      }
      local_98 = 1;
      EpsCopyInputStream::LimitToken::~LimitToken(&local_84);
      local_268 = local_68;
    }
    else {
      local_d8 = table_local;
      local_e0 = ctx_local;
      local_e4 = uStack_1cc;
      _old_group_depth = &local_220;
      iVar5 = *(int *)&table_local[1].class_data + -1;
      *(int *)&table_local[1].class_data = iVar5;
      if (iVar5 < 0) {
        local_d0 = (ParseContext *)0x0;
      }
      else {
        *(int *)((long)&table_local[1].class_data + 4) =
             *(int *)((long)&table_local[1].class_data + 4) + 1;
        absl_log_internal_check_op_result._4_4_ = *(int *)&table_local[1].class_data;
        absl_log_internal_check_op_result._0_4_ = *(int *)((long)&table_local[1].class_data + 4);
        local_18 = ctx_local;
        local_10 = _old_group_depth;
        local_e0 = (ParseContext *)
                   ParseLoopPreserveNone
                             (*(MessageLite **)inner_table,(char *)ctx_local,
                              (ParseContext *)table_local,(TcParseTableBase *)local_200);
        if (local_e0 != (ParseContext *)0x0) {
          iVar5 = absl::lts_20250127::log_internal::GetReferenceableValue
                            (absl_log_internal_check_op_result._4_4_);
          iVar6 = absl::lts_20250127::log_internal::GetReferenceableValue
                            (*(int *)&this[1].class_data);
          local_100 = absl::lts_20250127::log_internal::Check_EQImpl
                                (iVar5,iVar6,"old_depth == depth_");
          if (local_100 != (Nullable<const_char_*>)0x0) {
            pcVar7 = absl::lts_20250127::implicit_cast<char_const*>(local_100);
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&absl_log_internal_check_op_result_1,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                       ,0x491,pcVar7);
            pLVar12 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                                ((LogMessage *)&absl_log_internal_check_op_result_1);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_101,pLVar12);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&absl_log_internal_check_op_result_1);
          }
          iVar5 = absl::lts_20250127::log_internal::GetReferenceableValue
                            ((int)absl_log_internal_check_op_result);
          iVar6 = absl::lts_20250127::log_internal::GetReferenceableValue
                            (*(int *)((long)&this[1].class_data + 4));
          local_120 = absl::lts_20250127::log_internal::Check_EQImpl
                                (iVar5,iVar6,"old_group_depth == group_depth_");
          if (local_120 != (Nullable<const_char_*>)0x0) {
            pcVar7 = absl::lts_20250127::implicit_cast<char_const*>(local_120);
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_138,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                       ,0x492,pcVar7);
            pLVar12 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_138);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_121,pLVar12);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_138);
          }
          local_120 = (Nullable<const_char_*>)0x0;
        }
        *(int *)((long)&this[1].class_data + 4) = *(int *)((long)&this[1].class_data + 4) + -1;
        *(int *)&this[1].class_data = *(int *)&this[1].class_data + 1;
        bVar2 = EpsCopyInputStream::ConsumeEndGroup((EpsCopyInputStream *)this,local_e4);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          local_d0 = local_e0;
        }
        else {
          local_d0 = (ParseContext *)0x0;
        }
      }
      local_268 = local_d0;
    }
    return (char *)local_268;
  }
  pMStack_1e0 = msg_local;
  pcVar7 = (char *)(**(code **)(hasbits_local + 0x30))
                             (ptr_local,ctx_local,table_local,msg_local,hasbits_local,entry);
  return pcVar7;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpMessage(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint16_t type_card = entry.type_card;
  const uint16_t card = type_card & field_layout::kFcMask;

  // Check for repeated parsing:
  if (card == field_layout::kFcRepeated) {
    const uint16_t rep = type_card & field_layout::kRepMask;
    switch (rep) {
      case field_layout::kRepMessage:
        PROTOBUF_MUSTTAIL return MpRepeatedMessageOrGroup<is_split, false>(
            PROTOBUF_TC_PARAM_PASS);
      case field_layout::kRepGroup:
        PROTOBUF_MUSTTAIL return MpRepeatedMessageOrGroup<is_split, true>(
            PROTOBUF_TC_PARAM_PASS);
      default:
        PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;
  const uint16_t rep = type_card & field_layout::kRepMask;
  const bool is_group = rep == field_layout::kRepGroup;

  // Validate wiretype:
  switch (rep) {
    case field_layout::kRepMessage:
      if (decoded_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
        goto fallback;
      }
      break;
    case field_layout::kRepGroup:
      if (decoded_wiretype != WireFormatLite::WIRETYPE_START_GROUP) {
        goto fallback;
      }
      break;
    default: {
    fallback:
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
  }

  const bool is_oneof = card == field_layout::kFcOneof;
  bool need_init = false;
  if (card == field_layout::kFcOptional) {
    SetHas(entry, msg);
  } else if (is_oneof) {
    need_init = ChangeOneof(table, entry, data.tag() >> 3, ctx, msg);
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  SyncHasbits(msg, hasbits, table);
  MessageLite*& field = RefAt<MessageLite*>(base, entry.offset);

  const TcParseTableBase* inner_table =
      GetTableFromAux(type_card, *table->field_aux(&entry));
  if (need_init || field == nullptr) {
    field = NewMessage(inner_table, msg->GetArena());
  }
  const auto inner_loop = [&](const char* ptr) {
    return ParseLoopPreserveNone(field, ptr, ctx, inner_table);
  };
  return is_group ? ctx->ParseGroupInlined(ptr, decoded_tag, inner_loop)
                  : ctx->ParseLengthDelimitedInlined(ptr, inner_loop);
}